

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_lid_length_tlv(uint16_t *length,dlep_session *session,dlep_parser_value *value)

{
  uint16_t uVar1;
  uint16_t tmp16;
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  uint16_t *length_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,0x16),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    length_local._4_4_ = -1;
  }
  else {
    uVar1 = ntohs(*(uint16_t *)((session->parser).tlv_ptr + *(ushort *)(ptr + 4)));
    *length = uVar1;
    length_local._4_4_ = 0;
  }
  return length_local._4_4_;
}

Assistant:

int
dlep_reader_lid_length_tlv(uint16_t *length, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;
  uint16_t tmp16;
  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_LID_LENGTH_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp16, ptr, sizeof(tmp16));
  *length = ntohs(tmp16);

  return 0;
}